

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSurfaceAccess.cpp
# Opt level: O0

void __thiscall
tcu::SurfaceAccess::SurfaceAccess(SurfaceAccess *this,Surface *surface,PixelFormat *colorFmt)

{
  deUint8 dVar1;
  int iVar2;
  PixelFormat *colorFmt_local;
  Surface *surface_local;
  SurfaceAccess *this_local;
  
  this->m_surface = surface;
  dVar1 = getColorMask(colorFmt);
  this->m_colorMask = dVar1;
  this->m_x = 0;
  this->m_y = 0;
  iVar2 = Surface::getWidth(surface);
  this->m_width = iVar2;
  iVar2 = Surface::getHeight(surface);
  this->m_height = iVar2;
  return;
}

Assistant:

SurfaceAccess::SurfaceAccess (tcu::Surface& surface, const tcu::PixelFormat& colorFmt)
	: m_surface		(&surface)
	, m_colorMask	(getColorMask(colorFmt))
	, m_x			(0)
	, m_y			(0)
	, m_width		(surface.getWidth())
	, m_height		(surface.getHeight())
{
}